

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::date_t,duckdb::interval_t,duckdb::MadAccessor<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>>
          (Interpolator<false> *this,date_t *v_t,Vector *result,
          MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *accessor)

{
  idx_t iVar1;
  long lVar2;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>_>_>
  __comp_01;
  bool bVar3;
  ulong uVar4;
  idx_t iVar5;
  InvalidInputException *pIVar6;
  int64_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  RESULT_TYPE RVar10;
  interval_t iVar11;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t result_1;
  string local_78;
  pointer local_58;
  size_type sStack_50;
  pointer local_48;
  size_type sStack_40;
  
  bVar3 = this->desc;
  iVar8 = this->CRN;
  iVar9 = this->FRN;
  iVar1 = this->begin;
  iVar5 = this->end;
  local_78._M_dataplus._M_p = (pointer)accessor;
  local_78._M_string_length = (size_type)accessor;
  local_78.field_2._M_local_buf[0] = bVar3;
  if (iVar8 == iVar9) {
    if (iVar8 != iVar5 && iVar1 != iVar5) {
      uVar4 = (long)(iVar5 * 4 + iVar1 * -4) >> 2;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar3;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::date_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>>>>
                (v_t + iVar1,v_t + iVar8,v_t + iVar5,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar8 = this->FRN;
    }
    RVar10 = MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (accessor,v_t + iVar8);
    input._0_8_ = RVar10.micros;
    iVar7 = 0;
    bVar3 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar10,(interval_t *)&local_58,false);
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.micros = iVar7;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,RVar10._0_8_,input);
      InvalidInputException::InvalidInputException(pIVar6,&local_78);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar11.micros = sStack_50;
    iVar11._0_8_ = local_58;
  }
  else {
    if (iVar9 != iVar5 && iVar1 != iVar5) {
      uVar4 = (long)(iVar5 * 4 + iVar1 * -4) >> 2;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar3;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::date_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>>>>
                (v_t + iVar1,v_t + iVar9,v_t + iVar5,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar9 = this->FRN;
      iVar8 = this->CRN;
      iVar5 = this->end;
    }
    local_78._M_dataplus._M_p = (pointer)accessor;
    local_78._M_string_length = (size_type)accessor;
    local_78.field_2._M_local_buf[0] = bVar3;
    if (iVar8 != iVar5 && iVar9 != iVar5) {
      uVar4 = (long)(iVar5 * 4 + iVar9 * -4) >> 2;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar3;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::date_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>>>>
                (v_t + iVar9,v_t + iVar8,v_t + iVar5,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar9 = this->FRN;
    }
    RVar10 = MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (accessor,v_t + iVar9);
    input_00._0_8_ = RVar10.micros;
    iVar7 = 0;
    bVar3 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar10,(interval_t *)&local_58,false);
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.micros = iVar7;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,RVar10._0_8_,input_00);
      InvalidInputException::InvalidInputException(pIVar6,&local_78);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48 = local_58;
    sStack_40 = sStack_50;
    RVar10 = MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (accessor,v_t + this->CRN);
    input_01._0_8_ = RVar10.micros;
    iVar7 = 0;
    bVar3 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar10,(interval_t *)&local_58,false);
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.micros = iVar7;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,RVar10._0_8_,input_01);
      InvalidInputException::InvalidInputException(pIVar6,&local_78);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78._M_dataplus._M_p = local_58;
    local_78._M_string_length = sStack_50;
    iVar11 = CastInterpolation::Interpolate<duckdb::interval_t>
                       ((interval_t *)&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (interval_t *)&local_78);
  }
  return iVar11;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}